

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

string * __thiscall
helics::checkBrokerQuery_abi_cxx11_
          (string *__return_storage_ptr__,helics *this,BasicBrokerInfo *brk,string_view query)

{
  int iVar1;
  string *__str;
  void *__s1;
  char *__s;
  size_type __len2;
  size_type __rlen;
  bool bVar2;
  
  __s1 = (void *)query._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (brk == (BasicBrokerInfo *)0x5) {
    iVar1 = bcmp(__s1,"state",5);
    if (iVar1 == 0) {
      __str = stateString_abi_cxx11_((ConnectionState)this[0x2c]);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(__return_storage_ptr__,__str);
      return __return_storage_ptr__;
    }
LAB_00344843:
    bVar2 = false;
LAB_00344845:
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    if ((byte)this[0x2c] < 2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (brk == (BasicBrokerInfo *)0xb) {
      iVar1 = bcmp(__s1,"isconnected",0xb);
      if (iVar1 == 0) {
        __s = "false";
        if ((byte)this[0x2c] < 3) {
          __s = "true";
        }
        __len2 = 5 - (ulong)((byte)this[0x2c] < 3);
        goto LAB_00344897;
      }
      goto LAB_00344843;
    }
    if (brk != (BasicBrokerInfo *)0x6) goto LAB_00344843;
    iVar1 = bcmp(__s1,"exists",6);
    if (iVar1 != 0) {
      iVar1 = bcmp(__s1,"isinit",6);
      bVar2 = iVar1 == 0;
      goto LAB_00344845;
    }
  }
  __len2 = 4;
  __s = "true";
LAB_00344897:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (__return_storage_ptr__,0,0,__s,__len2);
  return __return_storage_ptr__;
}

Assistant:

static std::string checkBrokerQuery(const BasicBrokerInfo& brk, std::string_view query)
{
    std::string response;
    if (query == "exists") {
        response = "true";
    } else if (query == "isconnected") {
        response =
            (brk.state >= ConnectionState::CONNECTED && brk.state <= ConnectionState::OPERATING) ?
            "true" :
            "false";
    } else if (query == "state") {
        response = stateString(brk.state);
    } else if (query == "isinit") {
        if (brk.state >= ConnectionState::OPERATING) {
            response = "true";
            // if it is false we need to actually go check the federate directly
        }
    }
    return response;
}